

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::memLittle32_func(void *data,uint32 size)

{
  uint uVar1;
  uint32 *words;
  
  if (3 < size) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while (size >> 2 != uVar1);
  }
  return;
}

Assistant:

void
memLittle32_func(void *data, uint32 size)
{
	uint32 w;
	uint8 *bytes = (uint8*)data;
	uint32 *words = (uint32*)data;
	size >>= 2;
	while(size--){
		w = *words++;
		*bytes++ = w;
		*bytes++ = w >> 8;
		*bytes++ = w >> 16;
		*bytes++ = w >> 24;
	}
}